

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall CTape::CTape(CTape *this,int tape_lentgh)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  allocator_type aVar5;
  double __x;
  allocator_type local_1e0 [8];
  stringstream ss;
  ostream local_1d0 [376];
  string local_58 [32];
  CTape *local_38;
  
  std::vector<CNumber<27>,_std::allocator<CNumber<27>_>_>::vector
            (&this->m_tape,(long)tape_lentgh,local_1e0);
  (this->m_pos).m_number = 0;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_l2t)._M_t._M_impl.super__Rb_tree_header;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e0[0] = (allocator_type)0x20;
  pmVar2 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
           operator[](&this->m_l2t,(key_type *)local_1e0);
  *pmVar2 = 0;
  aVar5 = (allocator_type)0x41;
  while (local_1e0[0] = aVar5, (char)aVar5 < '[') {
    pmVar2 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](&this->m_l2t,(key_type *)local_1e0);
    *pmVar2 = (char)aVar5 + -0x40;
    aVar5 = (allocator_type)((char)local_1e0[0] + '\x01');
  }
  local_38 = this;
  for (p_Var4 = (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    poVar3 = std::operator<<(local_1d0,(char)p_Var4[1]._M_color);
    poVar3 = std::operator<<(poVar3," -> ");
    std::ostream::operator<<(poVar3,*(int *)&p_Var4[1].field_0x4);
    __x = (double)std::__cxx11::stringbuf::str();
    debug::log(__x);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
  }
  return;
}

Assistant:

CTape(const int tape_lentgh = TAPE_LENGTH): m_tape(tape_lentgh)
        {
            m_l2t[' '] = 0;
            for (char i = 'A'; i <= 'Z'; ++i)
            {
                m_l2t[i] = i - 'A' + 1;
            }
            for (l2t_t::const_iterator i = m_l2t.begin(); i != m_l2t.end(); ++i)
            {
                std::stringstream ss;
                ss << i->first << " -> " << i->second;
                debug::log(ss.str());
            }
        }